

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

ppc_slb_t * slb_lookup(PowerPCCPU_conflict3 *cpu,target_ulong eaddr)

{
  ppc_slb_t *ppVar1;
  ppc_slb_t *slb;
  int n;
  uint64_t esid_1T;
  uint64_t esid_256M;
  CPUPPCState_conflict2 *env;
  target_ulong eaddr_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  slb._4_4_ = 0;
  while( true ) {
    if (cpu->hash64_opts->slb_size <= slb._4_4_) {
      return (ppc_slb_t *)0x0;
    }
    ppVar1 = (cpu->env).slb + (int)slb._4_4_;
    if ((ppVar1->esid == (eaddr & 0xfffffffff0000000 | 0x8000000)) &&
       ((ppVar1->vsid & 0xc000000000000000) == 0)) break;
    if ((ppVar1->esid == (eaddr & 0xffffff0000000000 | 0x8000000)) &&
       ((ppVar1->vsid & 0xc000000000000000) == 0x4000000000000000)) {
      return ppVar1;
    }
    slb._4_4_ = slb._4_4_ + 1;
  }
  return ppVar1;
}

Assistant:

static ppc_slb_t *slb_lookup(PowerPCCPU *cpu, target_ulong eaddr)
{
    CPUPPCState *env = &cpu->env;
    uint64_t esid_256M, esid_1T;
    int n;

    LOG_SLB("%s: eaddr " TARGET_FMT_lx "\n", __func__, eaddr);

    esid_256M = (eaddr & SEGMENT_MASK_256M) | SLB_ESID_V;
    esid_1T = (eaddr & SEGMENT_MASK_1T) | SLB_ESID_V;

    for (n = 0; n < cpu->hash64_opts->slb_size; n++) {
        ppc_slb_t *slb = &env->slb[n];

        LOG_SLB("%s: slot %d %016" PRIx64 " %016"
                    PRIx64 "\n", __func__, n, slb->esid, slb->vsid);
        /*
         * We check for 1T matches on all MMUs here - if the MMU
         * doesn't have 1T segment support, we will have prevented 1T
         * entries from being inserted in the slbmte code.
         */
        if (((slb->esid == esid_256M) &&
             ((slb->vsid & SLB_VSID_B) == SLB_VSID_B_256M))
            || ((slb->esid == esid_1T) &&
                ((slb->vsid & SLB_VSID_B) == SLB_VSID_B_1T))) {
            return slb;
        }
    }

    return NULL;
}